

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O3

void __thiscall YAML::Node::EnsureNodeExists(Node *this)

{
  memory_holder *__p;
  memory *__p_00;
  node *this_00;
  InvalidNode *this_01;
  _Rb_tree_header *p_Var1;
  
  if (this->m_isValid == false) {
    this_01 = (InvalidNode *)__cxa_allocate_exception(0x40);
    InvalidNode::InvalidNode(this_01,&this->m_invalidKey);
    __cxa_throw(this_01,&InvalidNode::typeinfo,BadFile::~BadFile);
  }
  if (this->m_pNode != (node *)0x0) {
    return;
  }
  __p = (memory_holder *)operator_new(0x10);
  __p_00 = (memory *)operator_new(0x30);
  p_Var1 = &(__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__p_00->m_nodes)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_00->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__p->m_pMemory).super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<YAML::detail::memory*>
            (&(__p->m_pMemory).super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p_00);
  std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::
  reset<YAML::detail::memory_holder>
            (&(this->m_pMemory).
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>,__p);
  this_00 = detail::memory::create_node
                      ((((this->m_pMemory).
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_pMemory).
                       super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->m_pNode = this_00;
  detail::node::mark_defined(this_00);
  detail::node_data::set_null
            ((((this_00->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  return;
}

Assistant:

inline void Node::EnsureNodeExists() const {
  if (!m_isValid)
    throw InvalidNode(m_invalidKey);
  if (!m_pNode) {
    m_pMemory.reset(new detail::memory_holder);
    m_pNode = &m_pMemory->create_node();
    m_pNode->set_null();
  }
}